

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_gen.cc
# Opt level: O1

NumToEntryTable * __thiscall
google::protobuf::internal::anon_unknown_36::MakeNumToEntryTable
          (NumToEntryTable *__return_storage_ptr__,anon_unknown_36 *this,
          Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> ordered_fields)

{
  bool bVar1;
  anon_unknown_36 *paVar2;
  pointer pSVar3;
  Nonnull<const_char_*> failure_msg;
  Nonnull<const_char_*> extraout_RAX;
  uint uVar4;
  pointer pSVar5;
  uint32_t uVar6;
  short sVar7;
  ulong uVar8;
  uint uVar9;
  pointer pFVar10;
  bool bVar11;
  SkipEntryBlock local_60;
  anon_unknown_36 *local_40;
  pointer local_38;
  
  (__return_storage_ptr__->blocks).
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->blocks).
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->blocks).
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->skipmap32 = 0xffffffff;
  sVar7 = (short)ordered_fields.ptr_;
  bVar11 = sVar7 == 0;
  if (bVar11) {
    uVar6 = 0xffffffff;
  }
  else {
    uVar6 = 0xffffffff;
    pFVar10 = (pointer)0x0;
    paVar2 = this;
    do {
      if (ordered_fields.ptr_ <= pFVar10) {
        _GLOBAL__N_1::MakeNumToEntryTable();
        goto LAB_004406f8;
      }
      if (0x20 < *(int *)(*(long *)paVar2 + 4)) {
        __return_storage_ptr__->skipmap32 = uVar6;
        if (bVar11) {
          return __return_storage_ptr__;
        }
        if (sVar7 == (short)pFVar10) {
          return __return_storage_ptr__;
        }
        pSVar5 = (pointer)0x0;
        bVar11 = true;
        uVar4 = 0;
        local_40 = this;
        local_38 = ordered_fields.ptr_;
        goto LAB_004405b6;
      }
      uVar6 = uVar6 + (-1 << ((char)*(int *)(*(long *)paVar2 + 4) - 1U & 0x1f));
      pFVar10 = (pointer)((long)&pFVar10->field + 1);
      paVar2 = paVar2 + 0x20;
      bVar11 = sVar7 == (short)pFVar10;
    } while (!bVar11);
  }
  __return_storage_ptr__->skipmap32 = uVar6;
  return __return_storage_ptr__;
LAB_004405b6:
  if (local_38 <= (pointer)((ulong)pFVar10 & 0xffff)) {
LAB_004406f8:
    _GLOBAL__N_1::MakeNumToEntryTable();
    failure_msg = extraout_RAX;
LAB_004406fd:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_gen.cc"
               ,0x1e9,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_60);
  }
  uVar9 = *(uint *)(*(long *)(local_40 + (uint)((int)(pointer)((ulong)pFVar10 & 0xffff) << 5)) + 4);
  if (uVar4 < uVar9) {
    failure_msg = (Nonnull<const_char_*>)0x0;
  }
  else {
    failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((ulong)uVar9,(ulong)uVar4,"fnum > last_skip_entry_start");
  }
  if (failure_msg != (Nonnull<const_char_*>)0x0) goto LAB_004406fd;
  bVar1 = bVar11;
  if (0x60 < uVar9 - uVar4) {
    bVar1 = true;
  }
  if (bVar11) {
    bVar1 = bVar11;
  }
  bVar11 = bVar1;
  if (bVar1) {
    local_60.entries.
    super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_60.entries.
    super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_60.entries.
    super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_60.first_fnum = uVar9;
    std::
    vector<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
    ::emplace_back<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>
              (&__return_storage_ptr__->blocks,&local_60);
    if (local_60.entries.
        super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.entries.
                      super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_60.entries.
                            super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_60.entries.
                            super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    pSVar5 = (__return_storage_ptr__->blocks).
             super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
    bVar11 = false;
  }
  uVar4 = uVar9 - pSVar5->first_fnum;
  uVar8 = (ulong)(uVar4 >> 4);
  pSVar3 = (pSVar5->entries).
           super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(pSVar5->entries).
                    super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3 >> 2) <= uVar8) {
    do {
      local_60.first_fnum = CONCAT22((short)pFVar10,0xffff);
      std::
      vector<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
      ::emplace_back<google::protobuf::internal::TailCallTableInfo::SkipEntry16>
                (&pSVar5->entries,(SkipEntry16 *)&local_60);
      pSVar3 = (pSVar5->entries).
               super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while ((ulong)((long)(pSVar5->entries).
                           super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3 >> 2) <= uVar8)
    ;
  }
  uVar4 = uVar4 & 0xf;
  pSVar3[uVar8].skipmap = pSVar3[uVar8].skipmap + (short)(-1 << (sbyte)uVar4);
  uVar4 = uVar9 - uVar4;
  uVar9 = (int)pFVar10 + 1;
  pFVar10 = (pointer)(ulong)uVar9;
  if ((short)uVar9 == (short)local_38) {
    return __return_storage_ptr__;
  }
  goto LAB_004405b6;
}

Assistant:

TailCallTableInfo::NumToEntryTable MakeNumToEntryTable(
    absl::Span<const TailCallTableInfo::FieldOptions> ordered_fields) {
  TailCallTableInfo::NumToEntryTable num_to_entry_table;
  num_to_entry_table.skipmap32 = static_cast<uint32_t>(-1);

  // skip_entry_block is the current block of SkipEntries that we're
  // appending to.  cur_block_first_fnum is the number of the first
  // field represented by the block.
  uint16_t field_entry_index = 0;
  uint16_t N = ordered_fields.size();
  // First, handle field numbers 1-32, which affect only the initial
  // skipmap32 and don't generate additional skip-entry blocks.
  for (; field_entry_index != N; ++field_entry_index) {
    auto* field_descriptor = ordered_fields[field_entry_index].field;
    if (field_descriptor->number() > 32) break;
    auto skipmap32_index = field_descriptor->number() - 1;
    num_to_entry_table.skipmap32 -= 1 << skipmap32_index;
  }
  // If all the field numbers were less than or equal to 32, we will have
  // no further entries to process, and we are already done.
  if (field_entry_index == N) return num_to_entry_table;

  TailCallTableInfo::SkipEntryBlock* block = nullptr;
  bool start_new_block = true;
  // To determine sparseness, track the field number corresponding to
  // the start of the most recent skip entry.
  uint32_t last_skip_entry_start = 0;
  for (; field_entry_index != N; ++field_entry_index) {
    auto* field_descriptor = ordered_fields[field_entry_index].field;
    uint32_t fnum = static_cast<uint32_t>(field_descriptor->number());
    ABSL_CHECK_GT(fnum, last_skip_entry_start);
    if (start_new_block == false) {
      // If the next field number is within 15 of the last_skip_entry_start, we
      // continue writing just to that entry.  If it's between 16 and 31 more,
      // then we just extend the current block by one. If it's more than 31
      // more, we have to add empty skip entries in order to continue using the
      // existing block.  Obviously it's just 32 more, it doesn't make sense to
      // start a whole new block, since new blocks mean having to write out
      // their starting field number, which is 32 bits, as well as the size of
      // the additional block, which is 16... while an empty SkipEntry16 only
      // costs 32 bits.  So if it was 48 more, it's a slight space win; we save
      // 16 bits, but probably at the cost of slower run time.  We're choosing
      // 96 for now.
      if (fnum - last_skip_entry_start > 96) start_new_block = true;
    }
    if (start_new_block) {
      num_to_entry_table.blocks.push_back({fnum});
      block = &num_to_entry_table.blocks.back();
      start_new_block = false;
    }

    auto skip_entry_num = (fnum - block->first_fnum) / 16;
    auto skip_entry_index = (fnum - block->first_fnum) % 16;
    while (skip_entry_num >= block->entries.size())
      block->entries.push_back({0xFFFF, field_entry_index});
    block->entries[skip_entry_num].skipmap -= 1 << (skip_entry_index);

    last_skip_entry_start = fnum - skip_entry_index;
  }
  return num_to_entry_table;
}